

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

TidyMessageImpl *
formatStandardDynamic
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  TidyMessageImpl *pTVar1;
  char nodedesc [256];
  char acStack_128 [256];
  
  pTVar1 = (TidyMessageImpl *)0x0;
  memset(acStack_128,0,0x100);
  TagToString(node,acStack_128,0x100);
  if (code == 0x235) {
    pTVar1 = prvTidytidyMessageCreateWithNode
                       (doc,node,0x235,(uint)(doc->badForm != 0) * 3 + TidyWarning,acStack_128);
  }
  return pTVar1;
}

Assistant:

TidyMessageImpl *formatStandardDynamic(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char nodedesc[ 256 ] = {0};

    TagToString(node, nodedesc, sizeof(nodedesc));

    switch (code)
    {
        case DISCARDING_UNEXPECTED:
            /* Force error if in a bad form, or Issue #166 - repeated <main> element. */
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, doc->badForm ? TidyError : TidyWarning, nodedesc );
            break;
    }

    return NULL;
}